

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_union_hashcode(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  ostream *poVar1;
  
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"@Override");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"public int hashCode() {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,
                           "  java.util.List<java.lang.Object> list = new java.util.ArrayList<java.lang.Object>();"
                          );
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"  list.add(this.getClass().getName());");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"  org.apache.thrift.TFieldIdEnum setField = getSetField();");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"  if (setField != null) {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"    list.add(setField.getThriftFieldId());");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"    java.lang.Object value = getFieldValue();");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"    if (value instanceof org.apache.thrift.TEnum) {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,
                           "      list.add(((org.apache.thrift.TEnum)getFieldValue()).getValue());")
  ;
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"    } else {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"      list.add(value);");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"    }");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"  }");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"  return list.hashCode();");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar1,"}");
  return;
}

Assistant:

void t_java_generator::generate_union_hashcode(ostream& out, t_struct* tstruct) {
  (void)tstruct;
  indent(out) << "@Override" << endl;
  indent(out) << "public int hashCode() {" << endl;
  indent(out) << "  java.util.List<java.lang.Object> list = new java.util.ArrayList<java.lang.Object>();" << endl;
  indent(out) << "  list.add(this.getClass().getName());" << endl;
  indent(out) << "  org.apache.thrift.TFieldIdEnum setField = getSetField();" << endl;
  indent(out) << "  if (setField != null) {" << endl;
  indent(out) << "    list.add(setField.getThriftFieldId());" << endl;
  indent(out) << "    java.lang.Object value = getFieldValue();" << endl;
  indent(out) << "    if (value instanceof org.apache.thrift.TEnum) {" << endl;
  indent(out) << "      list.add(((org.apache.thrift.TEnum)getFieldValue()).getValue());" << endl;
  indent(out) << "    } else {" << endl;
  indent(out) << "      list.add(value);" << endl;
  indent(out) << "    }" << endl;
  indent(out) << "  }" << endl;
  indent(out) << "  return list.hashCode();" << endl;
  indent(out) << "}";
}